

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

double __thiscall
despot::Parser::ObsProb
          (Parser *this,OBS_TYPE obs,vector<int,_std::allocator<int>_> *state,ACT_TYPE action)

{
  pointer piVar1;
  CPT *pCVar2;
  uint uVar3;
  pointer pNVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar5 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 2;
    piVar6 = &(((this->curr_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar7 = 0;
    do {
      *piVar6 = piVar1[lVar7];
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 0x30;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  pNVar4 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (int)((ulong)((long)(this->obs_vars_).
                              super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4) >> 3) *
          -0x11111111 - 1;
  if ((int)uVar3 < 0) {
    dVar10 = 1.0;
  }
  else {
    uVar8 = (ulong)uVar3;
    lVar5 = uVar8 * 0x78 + 0x10;
    dVar10 = 1.0;
    do {
      pCVar2 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8];
      (*(pCVar2->super_Function)._vptr_Function[5])
                (pCVar2,obs % (ulong)(long)(int)((ulong)(*(long *)((long)&(pNVar4->super_Variable).
                                                                          _vptr_Variable + lVar5) -
                                                        *(long *)((long)pNVar4 + lVar5 + -8)) >> 5)
                        & 0xffffffff);
      dVar10 = dVar10 * extraout_XMM0_Qa;
      pNVar4 = (this->obs_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      obs = obs / (ulong)(long)(int)((ulong)(*(long *)((long)&(pNVar4->super_Variable).
                                                              _vptr_Variable + lVar5) -
                                            *(long *)((long)pNVar4 + lVar5 + -8)) >> 5);
      lVar5 = lVar5 + -0x78;
      bVar9 = uVar8 != 0;
      uVar8 = uVar8 - 1;
    } while (bVar9);
  }
  return dVar10;
}

Assistant:

double Parser::ObsProb(OBS_TYPE obs, const vector<int>& state,
	ACT_TYPE action) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	double prob = 1.0;
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		prob *= obs_funcs_[o]->GetValue(obs % obs_vars_[o].Size());
		obs /= obs_vars_[o].Size();
	}
	return prob;
}